

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relax_snode.c
# Opt level: O3

void relax_snode(int n,int *et,int relax_columns,int *descendants,int *relax_end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  ifill(relax_end,n,-1);
  if (0 < n) {
    uVar7 = (ulong)(uint)n;
    uVar6 = 0;
    memset(descendants,0,uVar7 * 4);
    do {
      iVar3 = et[uVar6];
      if (iVar3 != n) {
        descendants[iVar3] = descendants[uVar6] + descendants[iVar3] + 1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
    if (0 < n) {
      iVar3 = 0;
      do {
        lVar4 = (long)iVar3;
        lVar5 = lVar4;
        iVar2 = et[lVar4];
        while (iVar1 = iVar2, iVar1 != n) {
          lVar5 = (long)iVar1;
          if (relax_columns <= descendants[lVar5]) {
            lVar5 = (long)iVar3;
            break;
          }
          iVar3 = iVar1;
          iVar2 = et[lVar5];
        }
        relax_end[lVar4] = iVar3;
        iVar3 = (int)lVar5;
        do {
          lVar5 = lVar5 + 1;
          iVar3 = iVar3 + 1;
          if (descendants[lVar5] == 0) break;
        } while (lVar5 < (long)uVar7);
      } while (iVar3 < n);
    }
  }
  return;
}

Assistant:

void
relax_snode (
	     const     int n,
                  const int *et,           /* column elimination tree */
	     const int relax_columns, /* max no of columns allowed in a
					 relaxed snode */
	     int       *descendants,  /* no of descendants of each node
					 in the etree */
	     int       *relax_end     /* last column in a supernode */
	     )
{

    register int j, parent;
    register int snode_start;	/* beginning of a snode */
    
    ifill (relax_end, n, SLU_EMPTY);
    for (j = 0; j < n; j++) descendants[j] = 0;

    /* Compute the number of descendants of each node in the etree */
    for (j = 0; j < n; j++) {
	parent = et[j];
	if ( parent != n )  /* not the dummy root */
	    descendants[parent] += descendants[j] + 1;
    }

    /* Identify the relaxed supernodes by postorder traversal of the etree. */
    for (j = 0; j < n; ) { 
     	parent = et[j];
        snode_start = j;
 	while ( parent != n && descendants[parent] < relax_columns ) {
	    j = parent;
	    parent = et[j];
	}
	/* Found a supernode with j being the last column. */
	relax_end[snode_start] = j;		/* Last column is recorded */
	j++;
	/* Search for a new leaf */
	while ( descendants[j] != 0 && j < n ) j++;
    }

    /*printf("No of relaxed snodes: %d; relaxed columns: %d\n", 
		nsuper, no_relaxed_col); */
}